

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_main.c
# Opt level: O1

void extract_reference_file(char *name)

{
  byte *pbVar1;
  byte bVar2;
  bool bVar3;
  bool bVar4;
  FILE *__stream;
  char *pcVar5;
  FILE *__stream_00;
  uint uVar6;
  byte *pbVar7;
  uint uVar8;
  int iVar9;
  char buff [1024];
  undefined4 local_438;
  short local_434;
  
  snprintf((char *)&local_438,0x400,"%s/%s.uu",refdir);
  __stream = fopen((char *)&local_438,"r");
  failure("Couldn\'t open reference file %s",&local_438);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/test_utils/test_main.c"
                   ,L'ಁ',(uint)(__stream != (FILE *)0x0),"in != NULL",(void *)0x0);
  if (__stream != (FILE *)0x0) {
    do {
      pcVar5 = fgets((char *)&local_438,0x400,__stream);
      if (pcVar5 == (char *)0x0) {
        return;
      }
    } while (local_434 != 0x206e || local_438 != 0x69676562);
    __stream_00 = fopen(name,"wb");
    do {
      pcVar5 = fgets((char *)&local_438,0x400,__stream);
      if (pcVar5 == (char *)0x0) break;
      bVar3 = local_438._2_1_ == 'd';
      bVar4 = (short)local_438 == 0x6e65;
      if (bVar3 && bVar4) break;
      if ((local_438 & 0x3f) != 0x20) {
        uVar8 = local_438 & 0x3f ^ 0x20;
        pbVar7 = (byte *)((long)&local_438 + 1);
        do {
          assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/test_utils/test_main.c"
                           ,L'ಚ',(uint)((byte)(*pbVar7 - 0x20) < 0x41),"VALID_UUDECODE(p[0])",
                           (void *)0x0);
          assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/test_utils/test_main.c"
                           ,L'ಛ',(uint)((byte)(pbVar7[1] - 0x20) < 0x41),"VALID_UUDECODE(p[1])",
                           (void *)0x0);
          uVar6 = (pbVar7[1] & 0x3f ^ 0x20) << 0xc | (*pbVar7 & 0x3f ^ 0x20) << 0x12;
          fputc(uVar6 >> 0x10,__stream_00);
          if (uVar8 == 1) {
            pbVar7 = pbVar7 + 2;
            iVar9 = 0;
          }
          else {
            assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/test_utils/test_main.c"
                             ,L'ಡ',(uint)((byte)(pbVar7[2] - 0x20) < 0x41),"VALID_UUDECODE(p[0])",
                             (void *)0x0);
            pbVar1 = pbVar7 + 2;
            pbVar7 = pbVar7 + 3;
            uVar6 = uVar6 | (*pbVar1 & 0x3f ^ 0x20) << 6;
            fputc(uVar6 >> 8 & 0xff,__stream_00);
            iVar9 = uVar8 - 2;
          }
          if (iVar9 < 1) {
            uVar8 = 0;
          }
          else {
            assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/test_utils/test_main.c"
                             ,L'ಧ',(uint)((byte)(*pbVar7 - 0x20) < 0x41),"VALID_UUDECODE(p[0])",
                             (void *)0x0);
            bVar2 = *pbVar7;
            pbVar7 = pbVar7 + 1;
            fputc(uVar6 & 0xff | bVar2 & 0x3f ^ 0x20,__stream_00);
            uVar8 = iVar9 - 1;
          }
        } while (0 < (int)uVar8);
      }
    } while (!bVar3 || !bVar4);
    fclose(__stream_00);
    fclose(__stream);
  }
  return;
}

Assistant:

void
extract_reference_file(const char *name)
{
	char buff[1024];
	FILE *in, *out;

	snprintf(buff, sizeof(buff), "%s/%s.uu", refdir, name);
	in = fopen(buff, "r");
	failure("Couldn't open reference file %s", buff);
	assert(in != NULL);
	if (in == NULL)
		return;
	/* Read up to and including the 'begin' line. */
	for (;;) {
		if (fgets(buff, sizeof(buff), in) == NULL) {
			/* TODO: This is a failure. */
			return;
		}
		if (memcmp(buff, "begin ", 6) == 0)
			break;
	}
	/* Now, decode the rest and write it. */
	out = fopen(name, "wb");
	while (fgets(buff, sizeof(buff), in) != NULL) {
		char *p = buff;
		int bytes;

		if (memcmp(buff, "end", 3) == 0)
			break;

		bytes = UUDECODE(*p++);
		while (bytes > 0) {
			int n = 0;
			/* Write out 1-3 bytes from that. */
			assert(VALID_UUDECODE(p[0]));
			assert(VALID_UUDECODE(p[1]));
			n = UUDECODE(*p++) << 18;
			n |= UUDECODE(*p++) << 12;
			fputc(n >> 16, out);
			--bytes;
			if (bytes > 0) {
				assert(VALID_UUDECODE(p[0]));
				n |= UUDECODE(*p++) << 6;
				fputc((n >> 8) & 0xFF, out);
				--bytes;
			}
			if (bytes > 0) {
				assert(VALID_UUDECODE(p[0]));
				n |= UUDECODE(*p++);
				fputc(n & 0xFF, out);
				--bytes;
			}
		}
	}
	fclose(out);
	fclose(in);
}